

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImDrawIdx_resizeT(ImVector_ImDrawIdx *self,int new_size,ImDrawIdx v)

{
  unsigned_short local_2;
  
  ImVector<unsigned_short>::resize(self,new_size,&local_2);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImDrawIdx_resizeT(ImVector_ImDrawIdx* self,int new_size,const ImDrawIdx v)
{
    return self->resize(new_size,v);
}